

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlExcC14NProcessNamespacesAxis(xmlC14NCtxPtr ctx,xmlNodePtr cur,int visible)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlListPtr l;
  xmlNodePtr ns_00;
  bool bVar5;
  undefined1 local_c0 [8];
  xmlNs ns_default_1;
  xmlNs ns_default;
  xmlChar *pxStack_58;
  int i;
  xmlChar *prefix;
  int has_empty_ns_in_inclusive_list;
  int has_visibly_utilized_empty_ns;
  int has_empty_ns;
  int already_rendered;
  xmlAttrPtr attr;
  xmlListPtr list;
  xmlNsPtr ns;
  int visible_local;
  xmlNodePtr cur_local;
  xmlC14NCtxPtr ctx_local;
  
  bVar1 = false;
  bVar2 = false;
  if (((ctx == (xmlC14NCtxPtr)0x0) || (cur == (xmlNodePtr)0x0)) || (cur->type != XML_ELEMENT_NODE))
  {
    xmlC14NErrParam(ctx);
    return -1;
  }
  if (ctx->mode != XML_C14N_EXCLUSIVE_1_0) {
    xmlC14NErrParam(ctx);
    return -1;
  }
  l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
  if (l == (xmlListPtr)0x0) {
    xmlC14NErrMemory(ctx);
    return -1;
  }
  if (ctx->inclusive_ns_prefixes != (xmlChar **)0x0) {
    for (ns_default.context._4_4_ = 0;
        ctx->inclusive_ns_prefixes[ns_default.context._4_4_] != (xmlChar *)0x0;
        ns_default.context._4_4_ = ns_default.context._4_4_ + 1) {
      pxStack_58 = ctx->inclusive_ns_prefixes[ns_default.context._4_4_];
      iVar3 = xmlStrEqual(pxStack_58,(xmlChar *)"#default");
      if ((iVar3 != 0) || (iVar3 = xmlStrEqual(pxStack_58,""), iVar3 != 0)) {
        pxStack_58 = (xmlChar *)0x0;
        bVar2 = true;
      }
      ns_00 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,pxStack_58);
      if (((ns_00 != (xmlNodePtr)0x0) && (iVar3 = xmlC14NIsXmlNs((xmlNsPtr)ns_00), iVar3 == 0)) &&
         ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
          (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,ns_00,cur), iVar3 != 0)))) {
        iVar3 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)ns_00);
        if ((visible != 0) &&
           (iVar4 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)ns_00,cur), iVar4 < 0)) {
          xmlC14NErrMemory(ctx);
          goto LAB_00186a24;
        }
        if (iVar3 == 0) {
          xmlListInsert(l,ns_00);
        }
        iVar3 = xmlStrlen((xmlChar *)ns_00->children);
        if (iVar3 == 0) {
          bVar1 = true;
        }
      }
    }
  }
  bVar5 = cur->ns == (xmlNs *)0x0;
  if (bVar5) {
    list = (xmlListPtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
  }
  else {
    list = (xmlListPtr)cur->ns;
  }
  if ((list != (xmlListPtr)0x0) && (iVar3 = xmlC14NIsXmlNs((xmlNsPtr)list), iVar3 == 0)) {
    if ((visible != 0) &&
       (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
         (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,(xmlNodePtr)list,cur), iVar3 != 0)) &&
        (iVar3 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)list,ctx), iVar3 == 0)))) {
      xmlListInsert(l,list);
    }
    if ((visible != 0) &&
       (iVar3 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)list,cur), iVar3 < 0)) {
      xmlC14NErrMemory(ctx);
      goto LAB_00186a24;
    }
    iVar3 = xmlStrlen((xmlChar *)list[1].sentinel);
    if (iVar3 == 0) {
      bVar1 = true;
    }
  }
  for (_has_empty_ns = (xmlNodePtr)cur->properties; _has_empty_ns != (xmlNodePtr)0x0;
      _has_empty_ns = _has_empty_ns->next) {
    if (((_has_empty_ns->ns == (xmlNs *)0x0) ||
        (iVar3 = xmlC14NIsXmlNs(_has_empty_ns->ns), iVar3 != 0)) ||
       ((ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0 &&
        (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,_has_empty_ns,cur), iVar3 == 0)))) {
      if (((_has_empty_ns->ns != (xmlNs *)0x0) &&
          (iVar3 = xmlStrlen(_has_empty_ns->ns->prefix), iVar3 == 0)) &&
         (iVar3 = xmlStrlen(_has_empty_ns->ns->href), iVar3 == 0)) {
        bVar5 = true;
      }
    }
    else {
      iVar3 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,_has_empty_ns->ns,ctx);
      iVar4 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,_has_empty_ns->ns,cur);
      if (iVar4 < 0) {
        xmlC14NErrMemory(ctx);
        goto LAB_00186a24;
      }
      if ((iVar3 == 0) && (visible != 0)) {
        xmlListInsert(l,_has_empty_ns->ns);
      }
      iVar3 = xmlStrlen(_has_empty_ns->ns->prefix);
      if (iVar3 == 0) {
        bVar1 = true;
      }
    }
  }
  if (((visible == 0) || (!bVar5)) || ((bVar1 || (bVar2)))) {
    if (((visible != 0) && (!bVar1)) && (bVar2)) {
      memset(local_c0,0,0x30);
      iVar3 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)local_c0);
      if (iVar3 == 0) {
        xmlC14NPrintNamespaces((xmlNs *)local_c0,ctx);
      }
    }
  }
  else {
    memset(&ns_default_1.context,0,0x30);
    iVar3 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)&ns_default_1.context,ctx);
    if (iVar3 == 0) {
      xmlC14NPrintNamespaces((xmlNs *)&ns_default_1.context,ctx);
    }
  }
  xmlListWalk(l,xmlC14NPrintNamespacesWalker,ctx);
LAB_00186a24:
  xmlListDelete(l);
  return 0;
}

Assistant:

static int
xmlExcC14NProcessNamespacesAxis(xmlC14NCtxPtr ctx, xmlNodePtr cur, int visible)
{
    xmlNsPtr ns;
    xmlListPtr list;
    xmlAttrPtr attr;
    int already_rendered;
    int has_empty_ns = 0;
    int has_visibly_utilized_empty_ns = 0;
    int has_empty_ns_in_inclusive_list = 0;

    if ((ctx == NULL) || (cur == NULL) || (cur->type != XML_ELEMENT_NODE)) {
        xmlC14NErrParam(ctx);
        return (-1);
    }

    if(!xmlC14NIsExclusive(ctx)) {
        xmlC14NErrParam(ctx);
        return (-1);

    }

    /*
     * Create a sorted list to store element namespaces
     */
    list = xmlListCreate(NULL, xmlC14NNsCompare);
    if (list == NULL) {
        xmlC14NErrMemory(ctx);
        return (-1);
    }

    /*
     * process inclusive namespaces:
     * All namespace nodes appearing on inclusive ns list are
     * handled as provided in Canonical XML
     */
    if(ctx->inclusive_ns_prefixes != NULL) {
	xmlChar *prefix;
	int i;

	for (i = 0; ctx->inclusive_ns_prefixes[i] != NULL; ++i) {
	    prefix = ctx->inclusive_ns_prefixes[i];
	    /*
	     * Special values for namespace with empty prefix
	     */
            if (xmlStrEqual(prefix, BAD_CAST "#default")
                || xmlStrEqual(prefix, BAD_CAST "")) {
                prefix = NULL;
		has_empty_ns_in_inclusive_list = 1;
            }

	    ns = xmlSearchNs(cur->doc, cur, prefix);
	    if((ns != NULL) && !xmlC14NIsXmlNs(ns) && xmlC14NIsVisible(ctx, ns, cur)) {
		already_rendered = xmlC14NVisibleNsStackFind(ctx->ns_rendered, ns);
		if(visible) {
		    if (xmlC14NVisibleNsStackAdd(ctx->ns_rendered, ns, cur) < 0) {
                        xmlC14NErrMemory(ctx);
                        goto error;
                    }
		}
		if(!already_rendered) {
		    xmlListInsert(list, ns);
		}
		if(xmlStrlen(ns->prefix) == 0) {
		    has_empty_ns = 1;
		}
	    }
	}
    }

    /* add node namespace */
    if(cur->ns != NULL) {
	ns = cur->ns;
    } else {
        ns = xmlSearchNs(cur->doc, cur, NULL);
	has_visibly_utilized_empty_ns = 1;
    }
    if((ns != NULL) && !xmlC14NIsXmlNs(ns)) {
	if(visible && xmlC14NIsVisible(ctx, ns, cur)) {
	    if(!xmlExcC14NVisibleNsStackFind(ctx->ns_rendered, ns, ctx)) {
		xmlListInsert(list, ns);
	    }
	}
	if(visible) {
	    if (xmlC14NVisibleNsStackAdd(ctx->ns_rendered, ns, cur) < 0) {
                xmlC14NErrMemory(ctx);
                goto error;
            }
	}
	if(xmlStrlen(ns->prefix) == 0) {
	    has_empty_ns = 1;
	}
    }


    /* add attributes */
    for(attr = cur->properties; attr != NULL; attr = attr->next) {
        /*
         * we need to check that attribute is visible and has non
         * default namespace (XML Namespaces: "default namespaces
	 * do not apply directly to attributes")
         */
	if((attr->ns != NULL) && !xmlC14NIsXmlNs(attr->ns) && xmlC14NIsVisible(ctx, attr, cur)) {
	    already_rendered = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered, attr->ns, ctx);
	    if (xmlC14NVisibleNsStackAdd(ctx->ns_rendered, attr->ns, cur) < 0) {
                xmlC14NErrMemory(ctx);
                goto error;
            }
	    if(!already_rendered && visible) {
		xmlListInsert(list, attr->ns);
	    }
	    if(xmlStrlen(attr->ns->prefix) == 0) {
		has_empty_ns = 1;
	    }
	} else if((attr->ns != NULL) && (xmlStrlen(attr->ns->prefix) == 0) && (xmlStrlen(attr->ns->href) == 0)) {
	    has_visibly_utilized_empty_ns = 1;
	}
    }

    /*
     * Process xmlns=""
     */
    if(visible && has_visibly_utilized_empty_ns &&
	    !has_empty_ns && !has_empty_ns_in_inclusive_list) {
        xmlNs ns_default;

        memset(&ns_default, 0, sizeof(ns_default));

        already_rendered = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered, &ns_default, ctx);
	if(!already_rendered) {
	    xmlC14NPrintNamespaces(&ns_default, ctx);
	}
    } else if(visible && !has_empty_ns && has_empty_ns_in_inclusive_list) {
        xmlNs ns_default;

        memset(&ns_default, 0, sizeof(ns_default));
        if(!xmlC14NVisibleNsStackFind(ctx->ns_rendered, &ns_default)) {
	    xmlC14NPrintNamespaces(&ns_default, ctx);
	}
    }



    /*
     * print out all elements from list
     */
    xmlListWalk(list, xmlC14NPrintNamespacesWalker, (void *) ctx);

    /*
     * Cleanup
     */
error:
    xmlListDelete(list);
    return (0);
}